

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
cinatra::coro_http_connection::async_read_until<asio::basic_streambuf<std::allocator<char>>>
          (coro_http_connection *this,basic_streambuf<std::allocator<char>_> *buffer,
          string_view delim)

{
  coro_http_connection *in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  basic_streambuf<std::allocator<char>_> *in_stack_00000160;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_00000168;
  undefined1 in_stack_00000170 [16];
  
  set_last_time(in_RSI);
  coro_io::
  async_read_until<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::basic_streambuf<std::allocator<char>>>
            (in_stack_00000168,in_stack_00000160,(string_view)in_stack_00000170);
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_read_until(
      AsioBuffer &buffer, asio::string_view delim) noexcept {
    set_last_time();
#ifdef CINATRA_ENABLE_SSL
    if (use_ssl_) {
      return coro_io::async_read_until(*ssl_stream_, buffer, delim);
    }
    else {
#endif
      return coro_io::async_read_until(socket_, buffer, delim);
#ifdef CINATRA_ENABLE_SSL
    }
#endif
  }

  void set_last_time() {
    if (checkout_timeout_) {
      last_rwtime_ = std::chrono::system_clock::now();
    }
  }

  std::chrono::system_clock::time_point get_last_rwtime() {
    return last_rwtime_;
  }

  auto get_executor() { return executor_; }

  void close(bool need_cb = true) {
    if (has_closed_) {
      return;
    }

    asio::dispatch(socket_.get_executor(),
                   [this, need_cb, self = shared_from_this()] {
                     std::error_code ec;
                     socket_.shutdown(asio::socket_base::shutdown_both, ec);
                     socket_.close(ec);
                     if (need_cb && quit_cb_) {
                       quit_cb_(conn_id_);
                     }
                     has_closed_ = true;
                   });
  }

  void set_check_timeout(bool r) { checkout_timeout_ = r; }

  void handle_session_for_response() {
    if (request_.has_session()) {
      auto session =
          session_manager::get().get_session(request_.get_cached_session_id());
      if (session != nullptr && session->get_need_set_to_client()) {
        response_.add_cookie(session->get_session_cookie());
        session->set_need_set_to_client(false);
      }
    }
  }

 private:
  bool check_keep_alive() {
    if (parser_.has_close()) {
      return false;
    }
    return true;
  }

  void build_ws_handshake_head() {
    uint8_t sha1buf[20], key_src[60];
    char accept_key[29];

    std::memcpy(key_src, request_.get_header_value("sec-websocket-key").data(),
                24);
    std::memcpy(key_src + 24, ws_guid, 36);
    sha1_context ctx;
    init(ctx);
    update(ctx, key_src, sizeof(key_src));
    finish(ctx, sha1buf);

    code_utils::base64_encode(accept_key, sha1buf, sizeof(sha1buf), 0);

    response_.set_status_and_content(status_type::switching_protocols, "");

    response_.add_header("Upgrade", "WebSocket");
    response_.add_header("Connection", "Upgrade");
    response_.add_header("Sec-WebSocket-Accept", std::string(accept_key, 28));
    auto protocal_str = request_.get_header_value("sec-websocket-protocol");
#ifdef CINATRA_ENABLE_GZIP
    if (is_client_ws_compressed_) {
      response_.add_header("Sec-WebSocket-Extensions",
                           "permessage-deflate; client_no_context_takeover");
    }
#endif
    if (!protocal_str.empty()) {
      response_.add_header("Sec-WebSocket-Protocol", std::string(protocal_str));
    }
  }

  void set_address_impl(std::string &address, bool remote = true) {
    if (has_closed_) {
      return;
    }

    std::error_code ec;
    auto pt = remote ? socket_.remote_endpoint(ec) : socket_.local_endpoint(ec);
    if (ec) {
      return;
    }
    address = pt.address().to_string(ec);
    if (ec) {
      return;
    }
    address.append(":").append(std::to_string(pt.port()));
  }

 private:
  friend class multipart_reader_t<coro_http_connection>;
  coro_io::ExecutorWrapper<> *executor_;
  asio::ip::tcp::socket socket_;
  coro_http_router &router_;
  asio::streambuf head_buf_;
  std::string body_;
  asio::streambuf chunked_buf_;
  http_parser parser_;
  bool keep_alive_;
  coro_http_request request_;
  coro_http_response response_;
  std::vector<asio::const_buffer> buffers_;
  std::atomic<bool> has_closed_{false};
  uint64_t conn_id_{0};
  std::function<void(const uint64_t &conn_id)> quit_cb_ = nullptr;
  bool checkout_timeout_ = false;
  std::atomic<std::chrono::system_clock::time_point> last_rwtime_ =
      std::chrono::system_clock::now();
  uint64_t max_part_size_ = 8 * 1024 * 1024;
  std::string resp_str_;

#ifdef CINATRA_ENABLE_GZIP
  bool is_client_ws_compressed_ = false;
  std::string inflate_str_;
#endif

  websocket ws_;
#ifdef CINATRA_ENABLE_SSL
  std::unique_ptr<asio::ssl::context> ssl_ctx_ = nullptr;
  std::unique_ptr<asio::ssl::stream<asio::ip::tcp::socket &>> ssl_stream_;
  bool use_ssl_ = false;
#endif
  bool need_shrink_every_time_ = false;
  bool multi_buf_ = true;
  std::function<async_simple::coro::Lazy<void>(coro_http_request &,
                                               coro_http_response &)>
      default_handler_ = nullptr;
  std::string chunk_size_str_;
  std::string remote_addr_;
  int64_t max_http_body_len_ = 0;
#ifdef INJECT_FOR_HTTP_SEVER_TEST
  bool write_failed_forever_ = false;
  bool read_failed_forever_ = false;
#endif
};
}